

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  xml_attribute_struct *pxVar3;
  xml_node_struct *n_00;
  xml_memory_page *in_RCX;
  
  if ((n->header & 0x20) != 0) {
    xml_allocator::deallocate_string(alloc,n->name);
  }
  if ((n->header & 0x10) != 0) {
    xml_allocator::deallocate_string(alloc,n->value);
  }
  pxVar3 = n->first_attribute;
  while (pxVar3 != (xml_attribute_struct *)0x0) {
    pxVar1 = pxVar3->next_attribute;
    if ((pxVar3->header & 0x20) != 0) {
      xml_allocator::deallocate_string(alloc,pxVar3->name);
    }
    if ((pxVar3->header & 0x10) != 0) {
      xml_allocator::deallocate_string(alloc,pxVar3->value);
    }
    xml_allocator::deallocate_memory(alloc,(void *)0x28,(long)pxVar3 - (pxVar3->header >> 8),in_RCX)
    ;
    pxVar3 = pxVar1;
  }
  n_00 = n->first_child;
  while (n_00 != (xml_node_struct *)0x0) {
    pxVar2 = n_00->next_sibling;
    destroy_node(n_00,alloc);
    n_00 = pxVar2;
  }
  xml_allocator::deallocate_memory(alloc,(void *)0x40,(long)n - (n->header >> 8),in_RCX);
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		if (n->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(n->name);

		if (n->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), PUGI_IMPL_GETPAGE(n));
	}